

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void __thiscall sf2cute::RIFF::Write(RIFF *this,ostream *out)

{
  undefined8 uVar1;
  int iVar2;
  ostream *out_00;
  bool bVar3;
  size_type sVar4;
  reference this_00;
  pointer pRVar5;
  exception *anon_var_0;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_> *chunk;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  *__range2;
  string local_40;
  undefined4 local_1c;
  ostream *poStack_18;
  iostate old_exception_bits;
  ostream *out_local;
  RIFF *this_local;
  
  poStack_18 = out;
  out_local = (ostream *)this;
  local_1c = std::ios::exceptions();
  uVar1 = *(undefined8 *)(*(long *)poStack_18 + -0x18);
  iVar2 = (int)poStack_18;
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions(iVar2 + (int)uVar1);
  out_00 = poStack_18;
  name_abi_cxx11_(&local_40,this);
  sVar4 = size(this);
  WriteHeader(out_00,&local_40,sVar4 - 8);
  std::__cxx11::string::~string((string *)&local_40);
  __end2 = std::
           vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
           ::begin(&this->chunks_);
  chunk = (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
           *)std::
             vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
             ::end(&this->chunks_);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_*,_std::vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>_>
                                *)&chunk);
    if (!bVar3) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_*,_std::vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>_>
              ::operator*(&__end2);
    pRVar5 = std::
             unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
             ::operator->(this_00);
    (*pRVar5->_vptr_RIFFChunkInterface[4])(pRVar5,poStack_18);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_*,_std::vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void RIFF::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the RIFF header.
    WriteHeader(out, name(), size() - 8);

    // Write each chunks.
    for (const auto & chunk : chunks_) {
      chunk->Write(out);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}